

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O2

void __thiscall QFbCursor::pointerEvent(QFbCursor *this,QMouseEvent *e)

{
  char cVar1;
  QPoint QVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QPoint local_48;
  QRect local_40;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(e + 8) == 5) {
    local_30 = (QRect)QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
    QVar2 = QPointF::toPoint((QPointF *)&local_30);
    *(QPoint *)(this + 0x58) = QVar2;
    if (this[0x10] == (QFbCursor)0x1) {
      QVar3 = getCurrentRect(this);
      *(QRect *)(this + 0x20) = QVar3;
      if (this[0x41] == (QFbCursor)0x0) {
        local_30 = (QRect)(**(code **)(**(long **)(this + 0x18) + 0x68))();
        local_48 = (QPoint)(**(code **)(**(long **)(this + 0x18) + 0x68))();
        local_40 = QRect::translated((QRect *)(this + 0x20),&local_48);
        cVar1 = QRect::intersects(&local_30);
        if (cVar1 == '\0') goto LAB_001126fe;
      }
      (**(code **)(*(long *)this + 0xa0))(this);
    }
  }
LAB_001126fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbCursor::pointerEvent(const QMouseEvent &e)
{
    if (e.type() != QEvent::MouseMove)
        return;
    m_pos = e.globalPosition().toPoint();
    if (!mVisible)
        return;
    mCurrentRect = getCurrentRect();
    if (mOnScreen || mScreen->geometry().intersects(mCurrentRect.translated(mScreen->geometry().topLeft())))
        setDirty();
}